

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Square::clock_sweep(Nes_Square *this,int negative_adjust)

{
  byte bVar1;
  int iVar2;
  int in_ESI;
  Nes_Osc *in_RDI;
  int offset;
  int shift;
  int period;
  int sweep;
  int local_1c;
  
  bVar1 = in_RDI->regs[1];
  iVar2 = *(int *)((long)&in_RDI[1].output + 4) + -1;
  *(int *)((long)&in_RDI[1].output + 4) = iVar2;
  if (iVar2 < 0) {
    in_RDI->reg_written[1] = true;
    iVar2 = Nes_Osc::period(in_RDI);
    if ((((bVar1 & 7) != 0) && ((bVar1 & 0x80) != 0)) && (7 < iVar2)) {
      local_1c = iVar2 >> (bVar1 & 7);
      if ((bVar1 & 8) != 0) {
        local_1c = in_ESI - local_1c;
      }
      if (iVar2 + local_1c < 0x800) {
        in_RDI->regs[2] = (uchar)(local_1c + iVar2);
        in_RDI->regs[3] = in_RDI->regs[3] & 0xf8 | (byte)((uint)(local_1c + iVar2) >> 8) & 7;
      }
    }
  }
  if ((in_RDI->reg_written[1] & 1U) != 0) {
    in_RDI->reg_written[1] = false;
    *(uint *)((long)&in_RDI[1].output + 4) = (int)(uint)bVar1 >> 4 & 7;
  }
  return;
}

Assistant:

void Nes_Square::clock_sweep( int negative_adjust )
{
	int sweep = regs [1];
	
	if ( --sweep_delay < 0 )
	{
		reg_written [1] = true;
		
		int period = this->period();
		int shift = sweep & shift_mask;
		if ( shift && (sweep & 0x80) && period >= 8 )
		{
			int offset = period >> shift;
			
			if ( sweep & negate_flag )
				offset = negative_adjust - offset;
			
			if ( period + offset < 0x800 )
			{
				period += offset;
				// rewrite period
				regs [2] = period & 0xFF;
				regs [3] = (regs [3] & ~7) | ((period >> 8) & 7);
			}
		}
	}
	
	if ( reg_written [1] ) {
		reg_written [1] = false;
		sweep_delay = (sweep >> 4) & 7;
	}
}